

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O3

void capnp::compiler::anon_unknown_0::buildTokenSequenceList
               (Builder builder,Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *items)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  Orphan<capnp::compiler::Token> *pOVar2;
  StructBuilder other;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  Builder itemBuilder;
  StructBuilder local_b0;
  StructBuilder local_88;
  ListBuilder local_58;
  
  if (items->size_ != 0) {
    uVar3 = 0;
    do {
      pAVar1 = items->ptr;
      local_88.data = builder.builder.ptr + (uVar3 * builder.builder.step >> 3);
      local_88.segment = builder.builder.segment;
      local_88.capTable = builder.builder.capTable;
      capnp::_::PointerBuilder::initStructList
                (&local_58,(PointerBuilder *)&local_88,(ElementCount)pAVar1[uVar3].size_,
                 (StructSize)0x10003);
      if (pAVar1[uVar3].size_ != 0) {
        uVar4 = 1;
        uVar5 = 0;
        do {
          pOVar2 = pAVar1[uVar3].ptr;
          capnp::_::ListBuilder::getStructElement(&local_88,&local_58,uVar4 - 1);
          capnp::_::OrphanBuilder::asStruct(&local_b0,&pOVar2[uVar5].builder,(StructSize)0x0);
          other.capTable = local_b0.capTable;
          other.segment = local_b0.segment;
          other.data = local_b0.data;
          other.pointers = local_b0.pointers;
          other.dataSize = local_b0.dataSize;
          other.pointerCount = local_b0.pointerCount;
          other._38_2_ = local_b0._38_2_;
          capnp::_::StructBuilder::transferContentFrom(&local_88,other);
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar5 < pAVar1[uVar3].size_);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < items->size_);
  }
  return;
}

Assistant:

void buildTokenSequenceList(List<List<Token>>::Builder builder,
                            kj::Array<kj::Array<Orphan<Token>>>&& items) {
  for (uint i = 0; i < items.size(); i++) {
    auto& item = items[i];
    auto itemBuilder = builder.init(i, item.size());
    for (uint j = 0; j < item.size(); j++) {
      itemBuilder.adoptWithCaveats(j, kj::mv(item[j]));
    }
  }
}